

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_LU_invmult_inplace(m256v *LU,int rank,int *rowperm,int *inv_colperm,m256v *X_inout)

{
  int rank_00;
  m256v Y;
  m256v X;
  m256v local_48;
  m256v local_30;
  
  local_48.n_row = LU->n_row;
  local_30.n_row = LU->n_col;
  local_48.n_col = X_inout->n_col;
  local_48.rstride = X_inout->rstride;
  local_48.e = X_inout->e;
  rank_00 = local_48.n_row;
  if (local_30.n_row < local_48.n_row) {
    rank_00 = local_30.n_row;
  }
  if (rank != -1) {
    rank_00 = rank;
  }
  local_30.n_col = local_48.n_col;
  local_30.rstride = local_48.rstride;
  local_30.e = local_48.e;
  if (rowperm != (int *)0x0) {
    m256v_permute_rows(&local_48,rowperm);
  }
  m256v_L_invmult_inplace_p(LU,rank_00,&local_48,(int *)0x0);
  m256v_U_invmult_inplace_p(LU,rank_00,&local_30,(int *)0x0);
  if (inv_colperm != (int *)0x0) {
    m256v_permute_rows(&local_30,inv_colperm);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult_inplace)(const MV_GEN_TYPE* LU,
				int rank,
				const int* rowperm,
				const int* inv_colperm,
				MV_GEN_TYPE* X_inout)
{
	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Create adequate views */
	assert(LU->n_col <= X_inout->n_row);
	assert(LU->n_row <= X_inout->n_row);
	MV_GEN_TYPE X = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_col, X_inout->n_col);
	MV_GEN_TYPE Y = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_row, X_inout->n_col);

	/* Apply the row permutation */
	if (rowperm != NULL) {
		MV_GEN_N(_permute_rows)(&Y, rowperm);
	}

	MV_GEN_N(_L_invmult_inplace)(LU, rank, &Y);
	MV_GEN_N(_U_invmult_inplace)(LU, rank, &X);

	/* Apply the column permutation */
	if (inv_colperm != NULL) {
		MV_GEN_N(_permute_rows)(&X, inv_colperm);
	}
}